

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t despace32(char *bytes,size_t howmany)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  if (howmany != 0) {
    sVar2 = 0;
    do {
      if (0x20 < (byte)bytes[sVar2]) {
        bytes[sVar1] = bytes[sVar2];
        sVar1 = sVar1 + 1;
      }
      sVar2 = sVar2 + 1;
    } while (howmany != sVar2);
  }
  return sVar1;
}

Assistant:

size_t despace32(char *bytes, size_t howmany) {
  size_t pos = 0;
  for (size_t i = 0; i < howmany; i++) {
    char c = bytes[i];
    if ((unsigned char)c <= 32) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}